

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

bool __thiscall FirewirePort::WriteBroadcastReadRequest(FirewirePort *this,uint seq)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  uint uVar3;
  
  if (((((this->super_BasePort).IsAllBoardsRev4_5_ == false) &&
       ((this->super_BasePort).IsAllBoardsRev6_ == false)) &&
      ((this->super_BasePort).IsAllBoardsRev7_ == false)) &&
     ((this->super_BasePort).IsAllBoardsRev8_9_ != true)) {
    uVar3 = ~(-1 << ((byte)(this->super_BasePort).NumOfNodes_ & 0x1f));
  }
  else {
    uVar3 = (this->super_BasePort).BoardInUseMask_;
  }
  uVar2 = 0x1800;
  if ((this->super_BasePort).IsAllBoardsRev4_6_ != false) {
    uVar2 = 0xffffffff000f;
  }
  pp_Var1 = (this->super_BasePort)._vptr_BasePort;
  (*pp_Var1[5])(this,0,uVar2,(ulong)(seq * 0x10000 + uVar3),0,pp_Var1,seq);
  return true;
}

Assistant:

bool FirewirePort::WriteBroadcastReadRequest(unsigned int seq)
{
    quadlet_t bcReqData = (seq << 16);
    if (IsAllBoardsRev4_5_ || IsBroadcastShorterWait())
        bcReqData += BoardInUseMask_;
    else
        // For a mixed set of boards, disable the shorter wait capability by "tricking" the system into thinking
        // that all nodes are used in this configuration. Otherwise, boards with the shorter wait capability may
        // attempt to transmit at the same time as boards that do not have this capability. The FireWire bus
        // arbitration protocol should prevent disaster, but this could lead to lower efficiency.
        bcReqData += ((1 << NumOfNodes_)-1);

    nodeaddr_t bcReqAddr;
    if (IsAllBoardsRev4_6_)
        bcReqAddr = 0xffffffff000f;      // special address to trigger broadcast read
    else
        bcReqAddr = 0x1800;              // special address to trigger broadcast read

#if 1
    WriteQuadletNode(0, bcReqAddr, bcReqData);
    // WriteQuadletNode returns false because the "fake" broadcast packet to node 0 does not
    // return an ACK.
    return true;
#else
    return WriteQuadlet(FW_NODE_BROADCAST, bcReqAddr, bcReqData);
#endif
}